

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionParser::ParseContent
          (cmGeneratorExpressionParser *this,cmGeneratorExpressionEvaluatorVector *result)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  uint uVar2;
  const_iterator it;
  pointer puVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  int iVar6;
  cmGeneratorExpressionToken *pcVar7;
  _Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false> local_20;
  
  it._M_current = (this->it)._M_current;
  if (it._M_current ==
      (this->Tokens).
      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("this->it != this->Tokens.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                  ,0xce,
                  "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                 );
  }
  uVar2 = (it._M_current)->TokenType;
  if (uVar2 - 2 < 3) {
    if (this->NestingLevel != 0) {
      __assert_fail("false && \"Got unexpected syntax token.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf1,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    extendText(result,it);
    pcVar7 = (this->it)._M_current;
    if (pcVar7 == (this->Tokens).
                  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf3,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
  }
  else {
    if (uVar2 == 1) {
      (this->it)._M_current = it._M_current + 1;
      ParseGeneratorExpression(this,result);
      return;
    }
    if (uVar2 != 0) {
      __assert_fail("false && \"Unhandled token in generator expression.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf7,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
    if ((this->NestingLevel == 0) &&
       (puVar3 = (result->
                 super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
       (result->
       super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != puVar3)) {
      iVar6 = (*(puVar3[-1]._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl)->
                _vptr_cmGeneratorExpressionEvaluator[2])();
      if (iVar6 == 0) {
        pcVar7 = (this->it)._M_current;
        pcVar1 = (result->
                 super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                 .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl + 2;
        pcVar1->_vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)((long)pcVar1->_vptr_cmGeneratorExpressionEvaluator + pcVar7->Length);
        if (pcVar7 == (this->Tokens).
                      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("this->it != this->Tokens.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0xda,
                        "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                       );
        }
        goto LAB_0058f842;
      }
    }
    pcVar7 = (this->it)._M_current;
    local_20._M_head_impl = (cmGeneratorExpressionEvaluator *)operator_new(0x18);
    pp_Var4 = (_func_int **)pcVar7->Content;
    pp_Var5 = (_func_int **)pcVar7->Length;
    (local_20._M_head_impl)->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)&PTR__cmGeneratorExpressionEvaluator_00a2ad10;
    local_20._M_head_impl[1]._vptr_cmGeneratorExpressionEvaluator = pp_Var4;
    local_20._M_head_impl[2]._vptr_cmGeneratorExpressionEvaluator = pp_Var5;
    std::
    vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
    ::
    emplace_back<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>
              ((vector<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>>>
                *)result,
               (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
                *)&local_20);
    if (local_20._M_head_impl != (cmGeneratorExpressionEvaluator *)0x0) {
      (*(local_20._M_head_impl)->_vptr_cmGeneratorExpressionEvaluator[1])();
    }
    pcVar7 = (this->it)._M_current;
    if (pcVar7 == (this->Tokens).
                  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xe2,
                    "void cmGeneratorExpressionParser::ParseContent(cmGeneratorExpressionEvaluatorVector &)"
                   );
    }
  }
LAB_0058f842:
  (this->it)._M_current = pcVar7 + 1;
  return;
}

Assistant:

void cmGeneratorExpressionParser::ParseContent(
  cmGeneratorExpressionEvaluatorVector& result)
{
  assert(this->it != this->Tokens.end());
  switch (this->it->TokenType) {
    case cmGeneratorExpressionToken::Text: {
      if (this->NestingLevel == 0) {
        if (!result.empty() &&
            (*(result.end() - 1))->GetType() ==
              cmGeneratorExpressionEvaluator::Text) {
          // A comma in 'plain text' could have split text that should
          // otherwise be continuous. Extend the last text content instead of
          // creating a new one.
          cm::static_reference_cast<TextContent>(*(result.end() - 1))
            .Extend(this->it->Length);
          assert(this->it != this->Tokens.end());
          ++this->it;
          return;
        }
      }
      auto n =
        cm::make_unique<TextContent>(this->it->Content, this->it->Length);
      result.push_back(std::move(n));
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
    }
    case cmGeneratorExpressionToken::BeginExpression:
      assert(this->it != this->Tokens.end());
      ++this->it;
      this->ParseGeneratorExpression(result);
      return;
    case cmGeneratorExpressionToken::EndExpression:
    case cmGeneratorExpressionToken::ColonSeparator:
    case cmGeneratorExpressionToken::CommaSeparator:
      if (this->NestingLevel == 0) {
        extendText(result, this->it);
      } else {
        assert(false && "Got unexpected syntax token.");
      }
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
  }
  assert(false && "Unhandled token in generator expression.");
}